

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall Privkey_IsValid_true_Test::TestBody(Privkey_IsValid_true_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  bool is_valid;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey privkey;
  Privkey_IsValid_true_Test *this_local;
  
  privkey._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  gtest_ar_.message_.ptr_._3_1_ = cfd::core::Privkey::IsValid((Privkey *)local_30);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_78,(bool *)((long)&gtest_ar_.message_.ptr_ + 3),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_78,(AssertionResult *)0x690dd7,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0xec,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(Privkey, IsValid_true) {
  Privkey privkey(
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  bool is_valid = privkey.IsValid();
  EXPECT_TRUE(is_valid);
}